

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_error_manager.hpp
# Opt level: O3

void __thiscall duckdb::TaskErrorManager::ThrowException(TaskErrorManager *this)

{
  int iVar1;
  reference this_00;
  lock_guard<std::mutex> elock;
  string local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this_00 = vector<duckdb::ErrorData,_true>::operator[](&this->exceptions,0);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,anon_var_dwarf_643837b + 9);
    ErrorData::Throw(this_00,&local_38);
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void ThrowException() {
		lock_guard<mutex> elock(error_lock);
		D_ASSERT(!exceptions.empty());
		auto &entry = exceptions[0];
		entry.Throw();
	}